

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int * Cudd_VectorSupportIndex(DdManager *dd,DdNode **F,int n)

{
  uint uVar1;
  int *support;
  ulong uVar2;
  
  uVar1 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar1 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar1 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    support = (int *)0x0;
  }
  else {
    if (0 < (int)uVar1) {
      memset(support,0,(ulong)uVar1 << 2);
    }
    if (0 < n) {
      uVar2 = 0;
      do {
        ddSupportStep((DdNode *)((ulong)F[uVar2] & 0xfffffffffffffffe),support);
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
    }
    if (0 < n) {
      uVar2 = 0;
      do {
        ddClearFlag((DdNode *)((ulong)F[uVar2] & 0xfffffffffffffffe));
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
    }
  }
  return support;
}

Assistant:

int *
Cudd_VectorSupportIndex(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    int i;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    return(support);

}